

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_util.cpp
# Opt level: O2

bool duckdb::ArrowUtil::TryFetchChunk
               (ChunkScanState *scan_state,ClientProperties *options,idx_t batch_size,
               ArrowArray *out,idx_t *count,ErrorData *error,
               unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
               extension_type_cast)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  idx_t iVar3;
  DataChunk *pDVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  undefined4 extraout_var_00;
  long lVar8;
  ArrowArray *pAVar9;
  byte bVar10;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_168;
  ClientProperties local_150;
  ArrowAppender appender;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  ArrowArray local_80;
  
  bVar10 = 0;
  *count = 0;
  iVar2 = (*scan_state->_vptr_ChunkScanState[5])();
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_168,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             CONCAT44(extraout_var,iVar2));
  ClientProperties::ClientProperties(&local_150,options);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_b8,
               (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)extension_type_cast._M_h._M_buckets);
  ArrowAppender::ArrowAppender
            (&appender,(vector<duckdb::LogicalType,_true> *)&local_168,batch_size,&local_150,
             (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
              *)&local_b8);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b8);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_168);
  iVar3 = ChunkScanState::RemainingInChunk(scan_state);
  if (iVar3 != 0) {
    if (batch_size <= iVar3) {
      iVar3 = batch_size;
    }
    *count = *count + iVar3;
    pDVar4 = ChunkScanState::CurrentChunk(scan_state);
    iVar5 = ChunkScanState::CurrentOffset(scan_state);
    iVar6 = ChunkScanState::CurrentOffset(scan_state);
    ArrowAppender::Append(&appender,pDVar4,iVar5,iVar6 + iVar3,pDVar4->count);
    ChunkScanState::IncreaseOffset(scan_state,iVar3,false);
  }
  do {
    uVar7 = *count;
    if (batch_size <= uVar7) {
LAB_008bc83c:
      bVar1 = true;
      if (uVar7 != 0) {
        ArrowAppender::Finalize(&local_80,&appender);
        pAVar9 = &local_80;
        for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
          out->length = pAVar9->length;
          pAVar9 = (ArrowArray *)((long)pAVar9 + ((ulong)bVar10 * -2 + 1) * 8);
          out = (ArrowArray *)((long)out + (ulong)bVar10 * -0x10 + 8);
        }
      }
LAB_008bc868:
      ArrowAppender::~ArrowAppender(&appender);
      return bVar1;
    }
    iVar2 = (*scan_state->_vptr_ChunkScanState[2])(scan_state,error);
    if ((char)iVar2 == '\0') {
      iVar2 = (*scan_state->_vptr_ChunkScanState[3])(scan_state);
      if ((char)iVar2 != '\0') {
        iVar2 = (*scan_state->_vptr_ChunkScanState[4])(scan_state);
        ErrorData::operator=(error,(ErrorData *)CONCAT44(extraout_var_00,iVar2));
      }
      bVar1 = false;
      goto LAB_008bc868;
    }
    bVar1 = ChunkScanState::ChunkIsEmpty(scan_state);
    if (bVar1) {
LAB_008bc838:
      uVar7 = *count;
      goto LAB_008bc83c;
    }
    pDVar4 = ChunkScanState::CurrentChunk(scan_state);
    bVar1 = ChunkScanState::Finished(scan_state);
    if ((bVar1) || (pDVar4->count == 0)) goto LAB_008bc838;
    iVar3 = *count;
    iVar5 = ChunkScanState::RemainingInChunk(scan_state);
    uVar7 = batch_size - iVar3;
    if (iVar5 <= batch_size - iVar3) {
      uVar7 = iVar5;
    }
    ArrowAppender::Append(&appender,pDVar4,0,uVar7,pDVar4->count);
    *count = *count + uVar7;
    ChunkScanState::IncreaseOffset(scan_state,uVar7,false);
  } while( true );
}

Assistant:

bool ArrowUtil::TryFetchChunk(ChunkScanState &scan_state, ClientProperties options, idx_t batch_size, ArrowArray *out,
                              idx_t &count, ErrorData &error,
                              unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> extension_type_cast) {
	count = 0;
	ArrowAppender appender(scan_state.Types(), batch_size, std::move(options), std::move(extension_type_cast));
	const auto remaining_tuples_in_chunk = scan_state.RemainingInChunk();
	if (remaining_tuples_in_chunk) {
		// We start by scanning the non-finished current chunk
		idx_t cur_consumption = MinValue(remaining_tuples_in_chunk, batch_size);
		count += cur_consumption;
		auto &current_chunk = scan_state.CurrentChunk();
		appender.Append(current_chunk, scan_state.CurrentOffset(), scan_state.CurrentOffset() + cur_consumption,
		                current_chunk.size());
		scan_state.IncreaseOffset(cur_consumption);
	}
	while (count < batch_size) {
		if (!scan_state.LoadNextChunk(error)) {
			if (scan_state.HasError()) {
				error = scan_state.GetError();
			}
			return false;
		}
		if (scan_state.ChunkIsEmpty()) {
			// The scan was successful, but an empty chunk was returned
			break;
		}
		auto &current_chunk = scan_state.CurrentChunk();
		if (scan_state.Finished() || current_chunk.size() == 0) {
			break;
		}
		// The amount we still need to append into this chunk
		auto remaining = batch_size - count;

		// The amount remaining, capped by the amount left in the current chunk
		auto to_append_to_batch = MinValue(remaining, scan_state.RemainingInChunk());
		appender.Append(current_chunk, 0, to_append_to_batch, current_chunk.size());
		count += to_append_to_batch;
		scan_state.IncreaseOffset(to_append_to_batch);
	}
	if (count > 0) {
		*out = appender.Finalize();
	}
	return true;
}